

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.yy.c
# Opt level: O2

YY_BUFFER_STATE cod_yy_create_buffer(FILE *file,int size)

{
  YY_BUFFER_STATE b;
  char *pcVar1;
  
  b = (YY_BUFFER_STATE)ffs_malloc(0x40);
  if (b != (YY_BUFFER_STATE)0x0) {
    b->yy_buf_size = size;
    pcVar1 = (char *)ffs_malloc((long)(size + 2));
    b->yy_ch_buf = pcVar1;
    if (pcVar1 != (char *)0x0) {
      b->yy_is_our_buffer = 1;
      cod_yy_init_buffer(b,file);
      return b;
    }
  }
  yy_fatal_error("out of dynamic memory in yy_create_buffer()");
}

Assistant:

YY_BUFFER_STATE yy_create_buffer  (FILE * file, int  size )
{
	YY_BUFFER_STATE b;
    
	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state )  );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_buf_size = size;

	/* yy_ch_buf has to be 2 characters longer than the size given because
	 * we need to put in 2 end-of-buffer characters.
	 */
	b->yy_ch_buf = (char *) yyalloc( (yy_size_t) (b->yy_buf_size + 2)  );
	if ( ! b->yy_ch_buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_is_our_buffer = 1;

	yy_init_buffer( b, file );

	return b;
}